

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqGrNode.h
# Opt level: O3

int __thiscall EqGrNode::get_sup(EqGrNode *this,int idx,int clas)

{
  element_type *peVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  pointer psVar9;
  ulong uVar10;
  
  if (clas != -1) {
    peVar1 = (this->_set_sup).
             super___shared_ptr<std::vector<std::shared_ptr<Array>,_std::allocator<std::shared_ptr<Array>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    uVar6 = (ulong)clas;
    psVar9 = (peVar1->
             super__Vector_base<std::shared_ptr<Array>,_std::allocator<std::shared_ptr<Array>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar7 = (long)(peVar1->
                  super__Vector_base<std::shared_ptr<Array>,_std::allocator<std::shared_ptr<Array>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)psVar9 >> 4;
    if (uVar6 < uVar7) {
      plVar2 = (long *)**(long **)&psVar9[uVar6].
                                   super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>;
      uVar6 = (ulong)(uint)idx;
      lVar3 = *plVar2;
      uVar7 = plVar2[1] - lVar3 >> 2;
      if (uVar6 < uVar7) {
        return *(int *)(lVar3 + uVar6 * 4);
      }
    }
LAB_0010c593:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6,
               uVar7);
  }
  if ((long)this->num_class < 1) {
    iVar5 = 0;
  }
  else {
    peVar1 = (this->_set_sup).
             super___shared_ptr<std::vector<std::shared_ptr<Array>,_std::allocator<std::shared_ptr<Array>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    psVar9 = (peVar1->
             super__Vector_base<std::shared_ptr<Array>,_std::allocator<std::shared_ptr<Array>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar8 = (long)(peVar1->
                  super__Vector_base<std::shared_ptr<Array>,_std::allocator<std::shared_ptr<Array>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)psVar9 >> 4;
    uVar4 = (ulong)(uint)idx;
    uVar10 = 0;
    iVar5 = 0;
    do {
      uVar7 = uVar8;
      uVar6 = uVar8;
      if (uVar8 == uVar10) goto LAB_0010c593;
      lVar3 = *(long *)**(long **)&psVar9->super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>;
      uVar7 = ((long *)**(long **)&psVar9->super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>)[1]
              - lVar3 >> 2;
      uVar6 = uVar4;
      if (uVar7 <= uVar4) goto LAB_0010c593;
      iVar5 = iVar5 + *(int *)(lVar3 + uVar4 * 4);
      uVar10 = uVar10 + 1;
      psVar9 = psVar9 + 1;
    } while ((long)this->num_class != uVar10);
  }
  return iVar5;
}

Assistant:

int get_sup(int idx, int clas = -1) {
        if (clas == -1) {
            int sum = 0;
            //return sup in all classes
            for (int i = 0; i < num_class; i++)
                sum += (*_set_sup->at(i))[idx];
            return sum;
        } else return (*_set_sup->at(clas))[idx]; //return sup in class only
    }